

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConveyor.cpp
# Opt level: O3

void __thiscall chrono::ChConveyor::ChConveyor(ChConveyor *this,ChConveyor *other)

{
  int iVar1;
  ChLinkLockLock *pCVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem,&other->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChConveyor_00b10aa0;
  (this->conveyor_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->conveyor_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->conveyor_speed = other->conveyor_speed;
  pCVar2 = (ChLinkLockLock *)
           (**(code **)((long)(other->internal_link->super_ChLinkLock).super_ChLinkMarkers.
                              super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
                              _vptr_ChObj + 0x10))();
  this->internal_link = pCVar2;
  iVar1 = (*(other->conveyor_plate->super_ChPhysicsItem).super_ChObj._vptr_ChObj[2])();
  this->conveyor_plate = (ChBody *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(other->conveyor_truss->super_ChPhysicsItem).super_ChObj._vptr_ChObj[2])();
  this->conveyor_truss = (ChBody *)CONCAT44(extraout_var_00,iVar1);
  return;
}

Assistant:

ChConveyor::ChConveyor(const ChConveyor& other) : ChPhysicsItem(other) {
    conveyor_speed = other.conveyor_speed;
    internal_link = other.internal_link->Clone();
    conveyor_plate = other.conveyor_plate->Clone();
    conveyor_truss = other.conveyor_truss->Clone();

    //// RADU: more to do here
}